

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::TableSaveSettings(ImGuiTable *table)

{
  bool bVar1;
  ImGuiContext_conflict *pIVar2;
  int iVar3;
  float local_48;
  float local_44;
  int local_38;
  float width_or_weight;
  int n;
  bool save_ref_scale;
  ImGuiTableColumnSettings *column_settings;
  ImGuiTableColumn *column;
  ImGuiTableSettings *settings;
  ImGuiContext *g;
  ImGuiTable *table_local;
  
  table->IsSettingsDirty = false;
  pIVar2 = GImGui;
  if ((table->Flags & 0x10U) == 0) {
    column = (ImGuiTableColumn *)TableGetBoundSettings(table);
    if (column == (ImGuiTableColumn *)0x0) {
      column = (ImGuiTableColumn *)TableSettingsCreate(table->ID,table->ColumnsCount);
      iVar3 = ImChunkStream<ImGuiTableSettings>::offset_from_ptr
                        (&pIVar2->SettingsTables,(ImGuiTableSettings *)column);
      table->SettingsOffset = iVar3;
    }
    *(char *)&column->MaxX = (char)table->ColumnsCount;
    if (column->Flags != table->ID) {
      __assert_fail("settings->ID == table->ID",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_tables.cpp"
                    ,0xc91,"void ImGui::TableSaveSettings(ImGuiTable *)");
    }
    bVar1 = false;
    if ((int)*(char *)&column->MaxX == table->ColumnsCount) {
      bVar1 = *(char *)&column->MaxX <= *(char *)((long)&column->MaxX + 1);
    }
    if (!bVar1) {
      __assert_fail("settings->ColumnsCount == table->ColumnsCount && settings->ColumnsCountMax >= settings->ColumnsCount"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_tables.cpp"
                    ,0xc92,"void ImGui::TableSaveSettings(ImGuiTable *)");
    }
    column_settings = (ImGuiTableColumnSettings *)(table->Columns).Data;
    _n = ImGuiTableSettings::GetColumnSettings((ImGuiTableSettings *)column);
    bVar1 = false;
    column->WidthGiven = 0.0;
    for (local_38 = 0; local_38 < table->ColumnsCount; local_38 = local_38 + 1) {
      if (((uint)column_settings->WidthOrWeight & 8) == 0) {
        local_44 = (float)column_settings[1].UserID;
      }
      else {
        local_44 = column_settings[2].WidthOrWeight;
      }
      _n->WidthOrWeight = local_44;
      _n->Index = (ImGuiTableColumnIdx)local_38;
      _n->DisplayOrder = column_settings[6].SortOrder;
      _n->SortOrder = *(ImGuiTableColumnIdx *)((long)&column_settings[7].WidthOrWeight + 2);
      _n->field_0xb = _n->field_0xb & 0xfc | *(byte *)((long)&column_settings[8].UserID + 1) & 3;
      _n->field_0xb =
           _n->field_0xb & 0xfb | (*(byte *)((long)&column_settings[7].UserID + 3) & 1) << 2;
      _n->field_0xb = _n->field_0xb & 0xf7 | (((uint)column_settings->WidthOrWeight & 8) != 0) << 3;
      if (((uint)column_settings->WidthOrWeight & 8) == 0) {
        bVar1 = true;
      }
      if ((local_44 != (float)column_settings[2].UserID) ||
         (NAN(local_44) || NAN((float)column_settings[2].UserID))) {
        column->WidthGiven = (float)((uint)column->WidthGiven | 1);
      }
      if (column_settings[6].SortOrder != local_38) {
        column->WidthGiven = (float)((uint)column->WidthGiven | 2);
      }
      if (*(char *)((long)&column_settings[7].WidthOrWeight + 2) != -1) {
        column->WidthGiven = (float)((uint)column->WidthGiven | 8);
      }
      if ((bool)(*(byte *)((long)&column_settings[7].UserID + 3) & 1) !=
          (((uint)column_settings->WidthOrWeight & 2) == 0)) {
        column->WidthGiven = (float)((uint)column->WidthGiven | 4);
      }
      column_settings = (ImGuiTableColumnSettings *)&column_settings[8].Index;
      _n = _n + 1;
    }
    column->WidthGiven = (float)(table->Flags & (uint)column->WidthGiven);
    if (bVar1) {
      local_48 = table->RefScale;
    }
    else {
      local_48 = 0.0;
    }
    column->MinX = local_48;
    MarkIniSettingsDirty();
  }
  return;
}

Assistant:

void ImGui::TableSaveSettings(ImGuiTable* table)
{
    table->IsSettingsDirty = false;
    if (table->Flags & ImGuiTableFlags_NoSavedSettings)
        return;

    // Bind or create settings data
    ImGuiContext& g = *GImGui;
    ImGuiTableSettings* settings = TableGetBoundSettings(table);
    if (settings == NULL)
    {
        settings = TableSettingsCreate(table->ID, table->ColumnsCount);
        table->SettingsOffset = g.SettingsTables.offset_from_ptr(settings);
    }
    settings->ColumnsCount = (ImGuiTableColumnIdx)table->ColumnsCount;

    // Serialize ImGuiTable/ImGuiTableColumn into ImGuiTableSettings/ImGuiTableColumnSettings
    IM_ASSERT(settings->ID == table->ID);
    IM_ASSERT(settings->ColumnsCount == table->ColumnsCount && settings->ColumnsCountMax >= settings->ColumnsCount);
    ImGuiTableColumn* column = table->Columns.Data;
    ImGuiTableColumnSettings* column_settings = settings->GetColumnSettings();

    bool save_ref_scale = false;
    settings->SaveFlags = ImGuiTableFlags_None;
    for (int n = 0; n < table->ColumnsCount; n++, column++, column_settings++)
    {
        const float width_or_weight = (column->Flags & ImGuiTableColumnFlags_WidthStretch) ? column->StretchWeight : column->WidthRequest;
        column_settings->WidthOrWeight = width_or_weight;
        column_settings->Index = (ImGuiTableColumnIdx)n;
        column_settings->DisplayOrder = column->DisplayOrder;
        column_settings->SortOrder = column->SortOrder;
        column_settings->SortDirection = column->SortDirection;
        column_settings->IsEnabled = column->IsUserEnabled;
        column_settings->IsStretch = (column->Flags & ImGuiTableColumnFlags_WidthStretch) ? 1 : 0;
        if ((column->Flags & ImGuiTableColumnFlags_WidthStretch) == 0)
            save_ref_scale = true;

        // We skip saving some data in the .ini file when they are unnecessary to restore our state.
        // Note that fixed width where initial width was derived from auto-fit will always be saved as InitStretchWeightOrWidth will be 0.0f.
        // FIXME-TABLE: We don't have logic to easily compare SortOrder to DefaultSortOrder yet so it's always saved when present.
        if (width_or_weight != column->InitStretchWeightOrWidth)
            settings->SaveFlags |= ImGuiTableFlags_Resizable;
        if (column->DisplayOrder != n)
            settings->SaveFlags |= ImGuiTableFlags_Reorderable;
        if (column->SortOrder != -1)
            settings->SaveFlags |= ImGuiTableFlags_Sortable;
        if (column->IsUserEnabled != ((column->Flags & ImGuiTableColumnFlags_DefaultHide) == 0))
            settings->SaveFlags |= ImGuiTableFlags_Hideable;
    }
    settings->SaveFlags &= table->Flags;
    settings->RefScale = save_ref_scale ? table->RefScale : 0.0f;

    MarkIniSettingsDirty();
}